

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectInnerLoop(Parse *pParse,Select *p,ExprList *pEList,int srcTab,SortCtx *pSort,
                    DistinctCtx *pDistinct,SelectDest *pDest,int iContinue,int iBreak)

{
  u8 uVar1;
  u8 uVar2;
  int p1;
  Vdbe *v_00;
  ExprList *pEVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int p1_00;
  int p3;
  VdbeOp *pVVar8;
  CollSeq *zP4;
  ExprList *pSO;
  int addrTest;
  int r3;
  int r2_1;
  int r1_3;
  int nKey;
  int r1_2;
  int r2;
  int addr;
  int r1_1;
  int r1;
  CollSeq *pColl;
  int regPrev;
  int iJump;
  VdbeOp *pOp;
  int j;
  u8 ecelFlags;
  int regOrig;
  int regResult;
  int nPrefixReg;
  int nResultCol;
  int iParm;
  int eDest;
  int hasDistinct;
  int i;
  Vdbe *v;
  DistinctCtx *pDistinct_local;
  SortCtx *pSort_local;
  int srcTab_local;
  ExprList *pEList_local;
  Select *p_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  uVar1 = pDest->eDest;
  p1 = pDest->iSDParm;
  regOrig = 0;
  if (pDistinct == (DistinctCtx *)0x0) {
    uVar2 = '\0';
  }
  else {
    uVar2 = pDistinct->eTnctType;
  }
  pDistinct_local = (DistinctCtx *)pSort;
  if ((pSort != (SortCtx *)0x0) && (pSort->pOrderBy == (ExprList *)0x0)) {
    pDistinct_local = (DistinctCtx *)0x0;
  }
  if ((pDistinct_local == (DistinctCtx *)0x0) && (uVar2 == '\0')) {
    codeOffset(v_00,p->iOffset,iContinue);
  }
  regResult = pEList->nExpr;
  if (pDest->iSdst == 0) {
    if (pDistinct_local != (DistinctCtx *)0x0) {
      regOrig = **(int **)pDistinct_local;
      if ((pDistinct_local[2].addrTnct & 1) == 0) {
        regOrig = regOrig + 1;
      }
      pParse->nMem = regOrig + pParse->nMem;
    }
    pDest->iSdst = pParse->nMem + 1;
    pParse->nMem = regResult + pParse->nMem;
  }
  else if (pParse->nMem < pDest->iSdst + regResult) {
    pParse->nMem = regResult + pParse->nMem;
  }
  pDest->nSdst = regResult;
  iVar7 = pDest->iSdst;
  j = iVar7;
  if (srcTab < 0) {
    if (uVar1 != '\x03') {
      if (((uVar1 == '\n') || (uVar1 == '\t')) || (uVar1 == '\r')) {
        pOp._7_1_ = 1;
      }
      else {
        pOp._7_1_ = 0;
      }
      if (((pDistinct_local != (DistinctCtx *)0x0) && (uVar2 == '\0')) &&
         ((uVar1 != '\f' && (uVar1 != '\x0e')))) {
        pOp._7_1_ = pOp._7_1_ | 0xc;
        for (eDest = pDistinct_local->addrTnct; eDest < **(int **)pDistinct_local; eDest = eDest + 1
            ) {
          uVar4 = (uint)*(ushort *)(*(long *)pDistinct_local + (long)eDest * 0x20 + 0x24);
          if (uVar4 != 0) {
            pEList->a[(int)(uVar4 - 1)].u.x.iOrderByCol =
                 ((short)eDest + 1) - (short)pDistinct_local->addrTnct;
          }
        }
        j = 0;
      }
      regResult = sqlite3ExprCodeExprList(pParse,pEList,iVar7,0,pOp._7_1_);
    }
  }
  else {
    for (eDest = 0; eDest < regResult; eDest = eDest + 1) {
      sqlite3VdbeAddOp3(v_00,0x60,srcTab,eDest,iVar7 + eDest);
    }
  }
  if (uVar2 != '\0') {
    if (pDistinct->eTnctType == '\x01') {
      sqlite3VdbeChangeToNoop(v_00,pDistinct->addrTnct);
    }
    else if (pDistinct->eTnctType == '\x02') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = regResult + pParse->nMem;
      sqlite3VdbeChangeToNoop(v_00,pDistinct->addrTnct);
      pVVar8 = sqlite3VdbeGetOp(v_00,pDistinct->addrTnct);
      pVVar8->opcode = ';';
      pVVar8->p1 = 1;
      pVVar8->p2 = iVar5;
      iVar6 = sqlite3VdbeCurrentAddr(v_00);
      for (eDest = 0; eDest < regResult; eDest = eDest + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEList->a[eDest].pExpr);
        if (eDest < regResult + -1) {
          sqlite3VdbeAddOp3(v_00,0x4d,iVar7 + eDest,iVar6 + regResult,iVar5 + eDest);
        }
        else {
          sqlite3VdbeAddOp3(v_00,0x4e,iVar7 + eDest,iContinue,iVar5 + eDest);
        }
        sqlite3VdbeChangeP4(v_00,-1,(char *)zP4,-2);
        sqlite3VdbeChangeP5(v_00,0x80);
      }
      sqlite3VdbeAddOp3(v_00,0x40,iVar7,iVar5,regResult + -1);
    }
    else {
      codeDistinct(pParse,pDistinct->tabTnct,iContinue,regResult,iVar7);
    }
    if (pDistinct_local == (DistinctCtx *)0x0) {
      codeOffset(v_00,p->iOffset,iContinue);
    }
  }
  switch(uVar1) {
  case '\x01':
    iVar5 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(v_00,99,iVar7,regResult,iVar5);
    sqlite3VdbeAddOp4Int(v_00,0x7e,p1,iVar5,iVar7,regResult);
    sqlite3ReleaseTempReg(pParse,iVar5);
    break;
  case '\x02':
    sqlite3VdbeAddOp3(v_00,0x7f,p1,iVar7,regResult);
    break;
  case '\x03':
    sqlite3VdbeAddOp2(v_00,0x38,1,p1);
    break;
  default:
    break;
  case '\x05':
  case '\x06':
  case '\f':
  case '\x0e':
    iVar5 = sqlite3GetTempRange(pParse,regOrig + 1);
    sqlite3VdbeAddOp3(v_00,99,iVar7,regResult,iVar5 + regOrig);
    if (uVar1 == '\x06') {
      iVar6 = sqlite3VdbeCurrentAddr(v_00);
      sqlite3VdbeAddOp4Int(v_00,0x1e,p1 + 1,iVar6 + 4,iVar5,0);
      sqlite3VdbeAddOp4Int(v_00,0x7e,p1 + 1,iVar5,iVar7,regResult);
    }
    if (pDistinct_local == (DistinctCtx *)0x0) {
      iVar7 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v_00,0x73,p1,iVar7);
      sqlite3VdbeAddOp3(v_00,0x74,p1,iVar5,iVar7);
      sqlite3VdbeChangeP5(v_00,8);
      sqlite3ReleaseTempReg(pParse,iVar7);
    }
    else {
      pushOntoSorter(pParse,(SortCtx *)pDistinct_local,p,iVar5 + regOrig,iVar7,1,regOrig);
    }
    sqlite3ReleaseTempRange(pParse,iVar5,regOrig + 1);
    break;
  case '\a':
  case '\b':
    pSO._0_4_ = 0;
    pEVar3 = pDest->pOrderBy;
    iVar5 = pEVar3->nExpr;
    iVar6 = sqlite3GetTempReg(pParse);
    p1_00 = sqlite3GetTempRange(pParse,iVar5 + 2);
    p3 = p1_00 + iVar5 + 1;
    if (uVar1 == '\b') {
      pSO._0_4_ = sqlite3VdbeAddOp4Int(v_00,0x1e,p1 + 1,0,iVar7,regResult);
    }
    sqlite3VdbeAddOp3(v_00,99,iVar7,regResult,p3);
    if (uVar1 == '\b') {
      sqlite3VdbeAddOp2(v_00,0x7e,p1 + 1,p3);
      sqlite3VdbeChangeP5(v_00,0x10);
    }
    for (eDest = 0; eDest < iVar5; eDest = eDest + 1) {
      sqlite3VdbeAddOp2(v_00,0x41,iVar7 + (uint)pEVar3->a[eDest].u.x.iOrderByCol + -1,p1_00 + eDest)
      ;
    }
    sqlite3VdbeAddOp2(v_00,0x72,p1,p1_00 + iVar5);
    sqlite3VdbeAddOp3(v_00,99,p1_00,iVar5 + 2,iVar6);
    sqlite3VdbeAddOp4Int(v_00,0x7e,p1,iVar6,p1_00,iVar5 + 2);
    if ((int)pSO != 0) {
      sqlite3VdbeJumpHere(v_00,(int)pSO);
    }
    sqlite3ReleaseTempReg(pParse,iVar6);
    sqlite3ReleaseTempRange(pParse,p1_00,iVar5 + 2);
    break;
  case '\t':
  case '\r':
    if (pDistinct_local == (DistinctCtx *)0x0) {
      if (uVar1 == '\r') {
        sqlite3VdbeAddOp1(v_00,0x10,pDest->iSDParm);
      }
      else {
        sqlite3VdbeAddOp2(v_00,0x43,iVar7,regResult);
        sqlite3ExprCacheAffinityChange(pParse,iVar7,regResult);
      }
    }
    else {
      pushOntoSorter(pParse,(SortCtx *)pDistinct_local,p,iVar7,j,regResult,regOrig);
    }
    break;
  case '\n':
    if (pDistinct_local != (DistinctCtx *)0x0) {
      pushOntoSorter(pParse,(SortCtx *)pDistinct_local,p,iVar7,j,regResult,regOrig);
    }
    break;
  case '\v':
    if (pDistinct_local == (DistinctCtx *)0x0) {
      iVar5 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v_00,99,iVar7,regResult,iVar5,pDest->zAffSdst,regResult);
      sqlite3ExprCacheAffinityChange(pParse,iVar7,regResult);
      sqlite3VdbeAddOp4Int(v_00,0x7e,p1,iVar5,iVar7,regResult);
      sqlite3ReleaseTempReg(pParse,iVar5);
    }
    else {
      pushOntoSorter(pParse,(SortCtx *)pDistinct_local,p,iVar7,j,regResult,regOrig);
    }
  }
  if ((pDistinct_local == (DistinctCtx *)0x0) && (p->iLimit != 0)) {
    sqlite3VdbeAddOp2(v_00,0x30,p->iLimit,iBreak);
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  ExprList *pEList,       /* List of values being extracted */
  int srcTab,             /* Pull data from this table */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", pEList->a[i].zName));
    }
  }else if( eDest!=SRT_Exists ){
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated 
      ** iOrderByCol value to one more than the index of the ORDER BY 
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);
      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
      regOrig = 0;
      assert( eDest==SRT_Set || eDest==SRT_Mem 
           || eDest==SRT_Coroutine || eDest==SRT_Output );
    }
    nResultCol = sqlite3ExprCodeExprList(pParse,pEList,regResult,0,ecelFlags);
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nResultCol;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
        for(i=0; i<nResultCol; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
          if( i<nResultCol-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
            VdbeCoverage(v);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
            VdbeCoverage(v);
           }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nResultCol-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nResultCol,
                     regResult);
        break;
      }
    }
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg,regResult,1,nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol, 
            r1, pDest->zAffSdst, nResultCol);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of 
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0, 
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}